

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

int double_conversion::Bignum::PlusCompare(Bignum *a,Bignum *b,Bignum *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Chunk CVar6;
  Chunk CVar7;
  Chunk CVar8;
  uint uVar9;
  short *psVar10;
  Bignum *in_RDX;
  Bignum *in_RSI;
  Bignum *in_RDI;
  Chunk sum;
  Chunk chunk_c;
  Chunk chunk_b;
  Chunk chunk_a;
  int i;
  int min_exponent;
  Chunk borrow;
  int local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  iVar1 = BigitLength(in_RDI);
  iVar2 = BigitLength(in_RSI);
  if (iVar1 < iVar2) {
    local_4 = PlusCompare(in_RSI,in_RDX,
                          (Bignum *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    iVar1 = BigitLength(in_RDI);
    iVar1 = iVar1 + 1;
    iVar2 = BigitLength(in_RDX);
    if (iVar1 < iVar2) {
      local_4 = -1;
    }
    else {
      iVar2 = BigitLength(in_RDI);
      iVar3 = BigitLength(in_RDX);
      if (iVar3 < iVar2) {
        local_4 = 1;
      }
      else {
        iVar3 = (int)in_RDI->exponent_;
        iVar4 = BigitLength(in_RSI);
        if (iVar4 <= iVar3) {
          iVar4 = BigitLength(in_RDI);
          iVar5 = BigitLength(in_RDX);
          if (iVar4 < iVar5) {
            return -1;
          }
        }
        iVar5 = 0;
        psVar10 = std::min<short>(&in_RDI->exponent_,&in_RSI->exponent_);
        psVar10 = std::min<short>(psVar10,&in_RDX->exponent_);
        iVar4 = (int)*psVar10;
        local_2c = BigitLength(in_RDX);
        while (local_2c = local_2c + -1, iVar4 <= local_2c) {
          CVar6 = BigitOrZero((Bignum *)CONCAT44(iVar1,iVar2),iVar3);
          CVar7 = BigitOrZero((Bignum *)CONCAT44(iVar1,iVar2),iVar3);
          CVar8 = BigitOrZero((Bignum *)CONCAT44(iVar1,iVar2),iVar3);
          if (CVar8 + iVar5 < CVar6 + CVar7) {
            return 1;
          }
          uVar9 = (CVar8 + iVar5) - (CVar6 + CVar7);
          if (1 < uVar9) {
            return -1;
          }
          iVar5 = uVar9 * 0x10000000;
        }
        if (iVar5 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = -1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int Bignum::PlusCompare(const Bignum& a, const Bignum& b, const Bignum& c) {
  DOUBLE_CONVERSION_ASSERT(a.IsClamped());
  DOUBLE_CONVERSION_ASSERT(b.IsClamped());
  DOUBLE_CONVERSION_ASSERT(c.IsClamped());
  if (a.BigitLength() < b.BigitLength()) {
    return PlusCompare(b, a, c);
  }
  if (a.BigitLength() + 1 < c.BigitLength()) {
    return -1;
  }
  if (a.BigitLength() > c.BigitLength()) {
    return +1;
  }
  // The exponent encodes 0-bigits. So if there are more 0-digits in 'a' than
  // 'b' has digits, then the bigit-length of 'a'+'b' must be equal to the one
  // of 'a'.
  if (a.exponent_ >= b.BigitLength() && a.BigitLength() < c.BigitLength()) {
    return -1;
  }

  Chunk borrow = 0;
  // Starting at min_exponent all digits are == 0. So no need to compare them.
  const int min_exponent = (std::min)((std::min)(a.exponent_, b.exponent_), c.exponent_);
  for (int i = c.BigitLength() - 1; i >= min_exponent; --i) {
    const Chunk chunk_a = a.BigitOrZero(i);
    const Chunk chunk_b = b.BigitOrZero(i);
    const Chunk chunk_c = c.BigitOrZero(i);
    const Chunk sum = chunk_a + chunk_b;
    if (sum > chunk_c + borrow) {
      return +1;
    } else {
      borrow = chunk_c + borrow - sum;
      if (borrow > 1) {
        return -1;
      }
      borrow <<= kBigitSize;
    }
  }
  if (borrow == 0) {
    return 0;
  }
  return -1;
}